

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O1

bool __thiscall base_uint<256U>::EqualTo(base_uint<256U> *this,uint64_t b)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  if (this->pn[7] == 0) {
    uVar1 = 6;
    do {
      uVar2 = uVar1 + 1;
      if (uVar2 < 3) goto LAB_00767b5b;
      uVar3 = (ulong)uVar1;
      uVar1 = uVar1 - 1;
    } while (this->pn[uVar3] == 0);
    if (uVar2 < 3) {
LAB_00767b5b:
      if ((uint32_t)(b >> 0x20) == this->pn[1]) {
        bVar4 = this->pn[0] == (uint32_t)b;
        goto LAB_00767b2e;
      }
    }
  }
  bVar4 = false;
LAB_00767b2e:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool base_uint<BITS>::EqualTo(uint64_t b) const
{
    for (int i = WIDTH - 1; i >= 2; i--) {
        if (pn[i])
            return false;
    }
    if (pn[1] != (b >> 32))
        return false;
    if (pn[0] != (b & 0xfffffffful))
        return false;
    return true;
}